

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_test.cc
# Opt level: O0

void logger_worker(WorkerArgs *args)

{
  SimpleLogger *this;
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  undefined8 *in_RDI;
  int level;
  Timer *tt;
  SimpleLogger *ll;
  SimpleLogger *in_stack_ffffffffffffffb8;
  SimpleLogger *in_stack_ffffffffffffffc8;
  SimpleLogger *in_stack_ffffffffffffffd0;
  
  this = (SimpleLogger *)*in_RDI;
  do {
    iVar2 = get_random_level();
    if (iVar2 == 1) {
      if ((this != (SimpleLogger *)0x0) &&
         (iVar2 = SimpleLogger::getLogLevel(in_stack_ffffffffffffffb8), 0 < iVar2)) {
        uVar3 = TestSuite::Timer::getTimeUs((Timer *)in_stack_ffffffffffffffd0);
        SimpleLogger::put(this,1,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/tests/logger_test.cc"
                          ,"logger_worker",0x3a,"%ld",uVar3);
      }
    }
    else if (iVar2 == 2) {
      if ((this != (SimpleLogger *)0x0) &&
         (iVar2 = SimpleLogger::getLogLevel(in_stack_ffffffffffffffb8), 1 < iVar2)) {
        in_stack_ffffffffffffffd0 = this;
        uVar3 = TestSuite::Timer::getTimeUs((Timer *)this);
        SimpleLogger::put(in_stack_ffffffffffffffd0,2,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/tests/logger_test.cc"
                          ,"logger_worker",0x3c,"%ld",uVar3);
      }
    }
    else if (iVar2 == 3) {
      if ((this != (SimpleLogger *)0x0) &&
         (iVar2 = SimpleLogger::getLogLevel(in_stack_ffffffffffffffb8), 2 < iVar2)) {
        in_stack_ffffffffffffffc8 = this;
        uVar3 = TestSuite::Timer::getTimeUs((Timer *)in_stack_ffffffffffffffd0);
        SimpleLogger::put(in_stack_ffffffffffffffc8,3,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/tests/logger_test.cc"
                          ,"logger_worker",0x3e,"%ld",uVar3);
      }
    }
    else if (iVar2 == 4) {
      if ((this != (SimpleLogger *)0x0) &&
         (iVar2 = SimpleLogger::getLogLevel(in_stack_ffffffffffffffb8), 3 < iVar2)) {
        uVar3 = TestSuite::Timer::getTimeUs((Timer *)in_stack_ffffffffffffffd0);
        SimpleLogger::put(this,4,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/tests/logger_test.cc"
                          ,"logger_worker",0x40,"%ld",uVar3);
      }
    }
    else if (((iVar2 == 5) && (this != (SimpleLogger *)0x0)) &&
            (iVar2 = SimpleLogger::getLogLevel(in_stack_ffffffffffffffb8), 4 < iVar2)) {
      in_stack_ffffffffffffffb8 = this;
      uVar3 = TestSuite::Timer::getTimeUs((Timer *)in_stack_ffffffffffffffd0);
      SimpleLogger::put(in_stack_ffffffffffffffb8,5,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/tests/logger_test.cc"
                        ,"logger_worker",0x42,"%ld",uVar3);
    }
    bVar1 = TestSuite::Timer::timeover((Timer *)in_stack_ffffffffffffffc8);
  } while (((bVar1 ^ 0xffU) & 1) != 0);
  return;
}

Assistant:

void logger_worker(WorkerArgs* args) {
    SimpleLogger* ll = args->ll;
    TestSuite::Timer& tt = *args->tt;
    do {
        int level = get_random_level();
        if (level == 1) {
            _log_fatal(ll, "%ld", tt.getTimeUs());
        } else if (level == 2) {
            _log_err(ll, "%ld", tt.getTimeUs());
        } else if (level == 3) {
            _log_warn(ll, "%ld", tt.getTimeUs());
        } else if (level == 4) {
            _log_info(ll, "%ld", tt.getTimeUs());
        } else if (level == 5) {
            _log_debug(ll, "%ld", tt.getTimeUs());
        }
    } while(!tt.timeover());
}